

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utility.cc
# Opt level: O3

string * dd::GetCurrentDir_abi_cxx11_(void)

{
  string *in_RDI;
  char buf [1024];
  char acStack_418 [1032];
  
  GetCurrentDir(acStack_418,0x400);
  (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
  strlen(acStack_418);
  std::__cxx11::string::_M_construct<char_const*>();
  return in_RDI;
}

Assistant:

std::string GetCurrentDir()
	{
		int bufLen = 1024;
		char buf[1024];
		GetCurrentDir(buf, bufLen);
		std::string str = buf;
		return str;
	}